

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,void *value)

{
  format_specs *specs;
  
  specs = this->specs_;
  if (((specs != (format_specs *)0x0) && (specs->type != '\0')) && (specs->type != 'p')) {
    error_handler::on_error((error_handler *)this,"invalid type specifier");
  }
  basic_writer<fmt::v6::buffer_range<wchar_t>_>::write_pointer<unsigned_long>
            (&this->writer_,(unsigned_long)value,specs);
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const void* value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }